

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O1

Quaternion * AML::unit(Quaternion *__return_storage_ptr__,Quaternion *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = (rhs->field_0).data[3] * (rhs->field_0).data[3] +
          (rhs->field_0).data[2] * (rhs->field_0).data[2] +
          (rhs->field_0).data[0] * (rhs->field_0).data[0] +
          (rhs->field_0).data[1] * (rhs->field_0).data[1];
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if (dVar4 <= 0.0) {
    dVar4 = (rhs->field_0).data[0];
    dVar1 = (rhs->field_0).data[1];
    dVar2 = (rhs->field_0).data[3];
    (__return_storage_ptr__->field_0).data[2] = (rhs->field_0).data[2];
    (__return_storage_ptr__->field_0).data[3] = dVar2;
    (__return_storage_ptr__->field_0).data[0] = dVar4;
    (__return_storage_ptr__->field_0).data[1] = dVar1;
  }
  else {
    dVar1 = (rhs->field_0).data[1];
    dVar2 = (rhs->field_0).data[2];
    dVar3 = (rhs->field_0).data[3];
    (__return_storage_ptr__->field_0).data[0] = (rhs->field_0).data[0] / dVar4;
    (__return_storage_ptr__->field_0).data[1] = dVar1 / dVar4;
    (__return_storage_ptr__->field_0).data[2] = dVar2 / dVar4;
    (__return_storage_ptr__->field_0).data[3] = dVar3 / dVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion unit(const Quaternion& rhs)
    {
        double mag = norm(rhs);
        if (mag > 0.0)
        {
            return (Quaternion(rhs) / mag);
        }
        return Quaternion(rhs);
    }